

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcReinforcingMesh::~IfcReinforcingMesh(IfcReinforcingMesh *this)

{
  IfcElement *this_00;
  long *plVar1;
  long *plVar2;
  
  this_00 = (IfcElement *)
            ((long)&this[-1].super_IfcReinforcingElement.super_IfcBuildingElementComponent.
                    super_IfcBuildingElement.super_IfcElement.super_IfcProduct.super_IfcObject.
                    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL> + 0x18);
  *(undefined8 *)
   ((long)&this[-1].super_IfcReinforcingElement.super_IfcBuildingElementComponent.
           super_IfcBuildingElement.super_IfcElement.super_IfcProduct.super_IfcObject.
           super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL> + 0x18) = 0x95b2b0;
  (this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.super_IfcBuildingElement.
  super_IfcElement.super_IfcProduct.super_IfcObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x95b3f0;
  *(undefined8 *)
   &this[-1].super_IfcReinforcingElement.super_IfcBuildingElementComponent.super_IfcBuildingElement.
    super_IfcElement.field_0x138 = 0x95b2d8;
  *(undefined8 *)
   &this[-1].super_IfcReinforcingElement.super_IfcBuildingElementComponent.super_IfcBuildingElement.
    super_IfcElement.field_0x148 = 0x95b300;
  *(undefined8 *)&this[-1].super_IfcReinforcingElement.field_0x180 = 0x95b328;
  this[-1].MeshWidth.ptr = 4.84716342811863e-317;
  this[-1].TransverseBarSpacing = 4.84718319074447e-317;
  *(undefined8 *)&this[-1].field_0x1f8 = 0x95b3a0;
  *(undefined8 *)
   &(this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.super_IfcBuildingElement.
    super_IfcElement.super_IfcProduct.super_IfcObject = 0x95b3c8;
  plVar1 = *(long **)&(this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.
                      super_IfcBuildingElement.super_IfcElement.super_IfcProduct.super_IfcObject.
                      field_0x10;
  plVar2 = (long *)&(this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.
                    super_IfcBuildingElement.super_IfcElement.super_IfcProduct.super_IfcObject.
                    field_0x20;
  if (plVar1 != plVar2) {
    operator_delete(plVar1,*plVar2 + 1);
  }
  IfcElement::~IfcElement(this_00,&PTR_construction_vtable_24__0095b078);
  operator_delete(this_00,0x208);
  return;
}

Assistant:

IfcReinforcingMesh() : Object("IfcReinforcingMesh") {}